

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

void Mop_ManPrint(Mop_Man_t *p)

{
  int iVar1;
  int local_14;
  int iCube;
  int i;
  Mop_Man_t *p_local;
  
  printf(".%d\n",(ulong)(uint)p->nIns);
  printf(".%d\n",(ulong)(uint)p->nOuts);
  for (local_14 = 0; iVar1 = Vec_IntSize(p->vCubes), local_14 < iVar1; local_14 = local_14 + 1) {
    iVar1 = Vec_IntEntry(p->vCubes,local_14);
    Mop_ManPrintOne(p,iVar1);
  }
  printf(".e\n");
  return;
}

Assistant:

void Mop_ManPrint( Mop_Man_t * p )
{
    int i, iCube;
    printf( ".%d\n", p->nIns );
    printf( ".%d\n", p->nOuts );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
        Mop_ManPrintOne( p, iCube );
    printf( ".e\n" );
}